

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O0

void __thiscall QPainterPath::lineTo(QPainterPath *this,QPointF *p)

{
  long lVar1;
  QPointF p_00;
  bool bVar2;
  QPainterPathPrivate *pQVar3;
  qsizetype qVar4;
  Element *in_RSI;
  QPainterPathPrivate *in_RDI;
  long in_FS_OFFSET;
  QPainterPathPrivate *d;
  Element elm;
  parameter_type in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  qreal in_stack_ffffffffffffff98;
  Element *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p_00.xp._6_1_ = in_stack_ffffffffffffff96;
  p_00.xp._0_6_ = in_stack_ffffffffffffff90;
  p_00.xp._7_1_ = in_stack_ffffffffffffff97;
  p_00.yp = in_stack_ffffffffffffff98;
  bVar2 = hasValidCoords(p_00);
  if (bVar2) {
    ensureData((QPainterPath *)
               CONCAT17(in_stack_ffffffffffffff97,
                        CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
    detach((QPainterPath *)
           CONCAT17(in_stack_ffffffffffffff97,
                    CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
    pQVar3 = d_func((QPainterPath *)0x5b6b78);
    QPainterPathPrivate::maybeMoveTo
              ((QPainterPathPrivate *)
               CONCAT17(in_stack_ffffffffffffff97,
                        CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
    this_00 = in_RSI;
    QList<QPainterPath::Element>::constLast
              ((QList<QPainterPath::Element> *)in_stack_ffffffffffffff88);
    Element::operator_cast_to_QPointF(this_00);
    bVar2 = ::operator==((QPointF *)
                         CONCAT17(in_stack_ffffffffffffff97,
                                  CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                         (QPointF *)in_stack_ffffffffffffff88);
    if (!bVar2) {
      QPointF::x((QPointF *)in_RSI);
      QPointF::y((QPointF *)in_RSI);
      QList<QPainterPath::Element>::append
                ((QList<QPainterPath::Element> *)
                 CONCAT17(in_stack_ffffffffffffff97,
                          CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                 in_stack_ffffffffffffff88);
      qVar4 = QList<QPainterPath::Element>::size(&pQVar3->elements);
      bVar2 = true;
      if (qVar4 != 3) {
        qVar4 = QList<QPainterPath::Element>::size(&pQVar3->elements);
        bVar2 = false;
        if (qVar4 == 4) {
          bVar2 = QPainterPathPrivate::isClosed(in_RDI);
        }
      }
      pQVar3->field_0x84 = pQVar3->field_0x84 & 0xef | bVar2 << 4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPainterPath::lineTo(const QPointF &p)
{
#ifdef QPP_DEBUG
    printf("QPainterPath::lineTo() (%.2f,%.2f)\n", p.x(), p.y());
#endif

    if (!hasValidCoords(p)) {
#ifndef QT_NO_DEBUG
        qWarning("QPainterPath::lineTo: Adding point with invalid coordinates, ignoring call");
#endif
        return;
    }

    ensureData();
    detach();

    QPainterPathPrivate *d = d_func();
    Q_ASSERT(!d->elements.isEmpty());
    d->maybeMoveTo();
    if (p == QPointF(d->elements.constLast()))
        return;
    Element elm = { p.x(), p.y(), LineToElement };
    d->elements.append(elm);

    d->convex = d->elements.size() == 3 || (d->elements.size() == 4 && d->isClosed());
}